

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.h
# Opt level: O0

iterator __thiscall
fmt::v6::formatter<std::vector<int,std::allocator<int>>,char,void>::
format<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
          (formatter<std::vector<int,_std::allocator<int>_>,_char,_void> *this,
          vector<int,_std::allocator<int>_> *values,
          basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
          *ctx)

{
  bool bVar1;
  reference piVar2;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> bVar3;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *in_RDX;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> in_RDI;
  const_iterator end;
  const_iterator it;
  size_t i;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> out;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff46;
  char in_stack_ffffffffffffff47;
  int *in_stack_ffffffffffffff68;
  char **in_stack_ffffffffffffff70;
  back_insert_iterator<fmt::v6::internal::buffer<char>_> in_stack_ffffffffffffff78;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  ulong local_38;
  buffer<char> *local_30;
  buffer<char> *local_28;
  
  local_30 = (buffer<char> *)
             basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
             ::out(in_RDX);
  local_28 = (buffer<char> *)
             internal::copy<std::back_insert_iterator<fmt::v6::internal::buffer<char>>>
                       (in_stack_ffffffffffffff47,in_RDI);
  local_38 = 0;
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_ffffffffffffff47,
                                CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff38);
    if (!bVar1) {
LAB_0015cc5c:
      bVar3 = internal::copy<std::back_insert_iterator<fmt::v6::internal::buffer<char>>>
                        (in_stack_ffffffffffffff47,in_RDI);
      return (iterator)bVar3.container;
    }
    if (local_38 != 0) {
      local_28 = (buffer<char> *)
                 internal::copy<std::back_insert_iterator<fmt::v6::internal::buffer<char>>>
                           (in_stack_ffffffffffffff47,in_RDI);
    }
    in_stack_ffffffffffffff46 = local_38 != 0;
    in_stack_ffffffffffffff47 = in_stack_ffffffffffffff46;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_40);
    internal::format_str_quoted<int,_0>((bool)(in_stack_ffffffffffffff46 & 1),piVar2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_40);
    local_28 = (buffer<char> *)
               format_to<fmt::v6::internal::buffer<char>,_const_char_*,_const_int_&,_0>
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68);
    local_38 = local_38 + 1;
    if (0x100 < local_38) {
      local_28 = (buffer<char> *)
                 format_to<fmt::v6::internal::buffer<char>,_char[22],_0>
                           (in_stack_ffffffffffffff78,(char (*) [22])local_28);
      goto LAB_0015cc5c;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40);
  } while( true );
}

Assistant:

typename FormatContext::iterator format(const RangeT& values,
                                          FormatContext& ctx) {
    auto out = internal::copy(formatting.prefix, ctx.out());
    std::size_t i = 0;
    for (auto it = values.begin(), end = values.end(); it != end; ++it) {
      if (i > 0) {
        if (formatting.add_prepostfix_space) *out++ = ' ';
        out = internal::copy(formatting.delimiter, out);
      }
      out = format_to(out,
                      internal::format_str_quoted(
                          (formatting.add_delimiter_spaces && i > 0), *it),
                      *it);
      if (++i > formatting.range_length_limit) {
        out = format_to(out, " ... <other elements>");
        break;
      }
    }
    if (formatting.add_prepostfix_space) *out++ = ' ';
    return internal::copy(formatting.postfix, out);
  }